

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS
VerifyJsonParsesAsListOfListsOfNumbers
          (_Bool IsJson5,char *Json,size_t *SubListLengthArray,size_t SubListLengthArrayCount)

{
  uint64_t uVar1;
  JlDataObject *pJVar2;
  size_t sVar3;
  JL_STATUS JVar4;
  JL_DATA_TYPE JVar5;
  uint32_t uVar6;
  JL_STATUS JVar7;
  size_t x;
  ulong uVar8;
  bool Condition;
  JlDataObject *subListObject;
  JlDataObject *object;
  uint64_t u64;
  JlListItem *subEnumerator;
  JlDataObject *listObject;
  size_t errorAtPos;
  WJTL_STATUS local_8c;
  JlDataObject *local_88;
  JlDataObject *local_80;
  JlDataObject *local_78;
  size_t local_70;
  size_t *local_68;
  uint64_t local_60;
  JlListItem *local_58;
  JlListItem *local_50;
  JlDataObject *local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = (JlDataObject *)0x0;
  local_38 = 100;
  local_88 = (JlDataObject *)0x0;
  local_68 = SubListLengthArray;
  JVar4 = JlParseJsonEx(Json,IsJson5,&local_48,&local_38);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x26f);
  local_78 = local_48;
  WjTestLib_Assert(local_48 != (JlDataObject *)0x0,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x270);
  JVar5 = JlGetObjectType(local_48);
  WjTestLib_Assert(JVar5 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x271);
  sVar3 = local_38;
  WjTestLib_Assert(local_38 == 0,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x272);
  uVar6 = JlGetListCount(local_48);
  local_8c = WJTL_STATUS_FAILED;
  if (uVar6 == SubListLengthArrayCount) {
    local_8c = WJTL_STATUS_SUCCESS;
  }
  if (sVar3 != 0) {
    local_8c = WJTL_STATUS_FAILED;
  }
  if (JVar5 != JL_DATA_TYPE_LIST) {
    local_8c = WJTL_STATUS_FAILED;
  }
  local_70 = 0;
  if (local_78 == (JlDataObject *)0x0) {
    local_8c = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_STATUS_SUCCESS) {
    local_8c = WJTL_STATUS_FAILED;
  }
  local_40 = SubListLengthArrayCount;
  WjTestLib_Assert(uVar6 == SubListLengthArrayCount,
                   "JlGetListCount( listObject ) == SubListLengthArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x274);
  local_50 = (JlListItem *)0x0;
  local_78 = (JlDataObject *)0x0;
  for (; local_70 != local_40; local_70 = local_70 + 1) {
    local_88 = (JlDataObject *)0x0;
    JVar4 = JlGetObjectListNextItem(local_48,&local_88,&local_50);
    WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectListNextItem( listObject, &subListObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27b);
    pJVar2 = local_88;
    WjTestLib_Assert(local_88 != (JlDataObject *)0x0,"(subListObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27c);
    JVar5 = JlGetObjectType(local_88);
    WjTestLib_Assert(JVar5 == JL_DATA_TYPE_LIST,
                     "JlGetObjectType( subListObject ) == JL_DATA_TYPE_LIST",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27d);
    uVar6 = JlGetListCount(local_88);
    if (local_68[local_70] != (ulong)uVar6) {
      local_8c = WJTL_STATUS_FAILED;
    }
    if (JVar5 != JL_DATA_TYPE_LIST) {
      local_8c = WJTL_STATUS_FAILED;
    }
    if (pJVar2 == (JlDataObject *)0x0) {
      local_8c = WJTL_STATUS_FAILED;
    }
    if (JVar4 != JL_STATUS_SUCCESS) {
      local_8c = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(local_68[local_70] == (ulong)uVar6,
                     "JlGetListCount( subListObject ) == SubListLengthArray[i]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27e);
    local_58 = (JlListItem *)0x0;
    local_80 = (JlDataObject *)0x0;
    for (uVar8 = 0; uVar8 < local_68[local_70]; uVar8 = uVar8 + 1) {
      local_60 = 0xffffffffffffffff;
      local_80 = (JlDataObject *)0x0;
      JVar4 = JlGetObjectListNextItem(local_88,&local_80,&local_58);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( subListObject, &object, &subEnumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x286);
      pJVar2 = local_80;
      WjTestLib_Assert(local_80 != (JlDataObject *)0x0,"(object) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x287);
      JVar7 = JlGetObjectNumberU64(local_80,&local_60);
      if (JVar4 != JL_STATUS_SUCCESS || JVar7 != JL_STATUS_SUCCESS) {
        local_8c = WJTL_STATUS_FAILED;
      }
      if (pJVar2 == (JlDataObject *)0x0) {
        local_8c = WJTL_STATUS_FAILED;
      }
      uVar1 = uVar8 + 1 + (long)local_78;
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x288);
      Condition = uVar1 == local_60;
      if (!Condition) {
        local_8c = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(Condition,"u64 == counter",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x28a);
    }
    JVar4 = JlGetObjectListNextItem(local_88,&local_80,&local_58);
    if (JVar4 != JL_STATUS_END_OF_DATA) {
      local_8c = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar4 == JL_STATUS_END_OF_DATA,
                     "(JlGetObjectListNextItem( subListObject, &object, &subEnumerator )) == (JL_STATUS_END_OF_DATA)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x28e);
    local_78 = (JlDataObject *)((long)local_78 + uVar8);
  }
  JVar4 = JlGetObjectListNextItem(local_48,&local_88,&local_50);
  WjTestLib_Assert(JVar4 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &subListObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x293);
  JVar7 = JlFreeObjectTree(&local_48);
  if (JVar7 != JL_STATUS_SUCCESS) {
    local_8c = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_STATUS_END_OF_DATA) {
    local_8c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x296);
  return local_8c;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfListsOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        size_t*         SubListLengthArray,
        size_t          SubListLengthArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   subListObject = NULL;
    uint64_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == SubListLengthArrayCount );

    // Verify all elements in list match array
    enumerator = NULL;
    for( size_t i=0; i<SubListLengthArrayCount; i++ )
    {
        subListObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &subListObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( subListObject );
        JL_ASSERT( JlGetObjectType( subListObject ) == JL_DATA_TYPE_LIST );
        JL_ASSERT( JlGetListCount( subListObject ) == SubListLengthArray[i] );

        JlListItem*     subEnumerator = NULL;
        JlDataObject*   object = NULL;
        for( size_t x=0; x<SubListLengthArray[i]; x++ )
        {
            uint64_t u64 = UINT64_MAX;
            object = NULL;
            JL_ASSERT_SUCCESS( JlGetObjectListNextItem( subListObject, &object, &subEnumerator ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            counter += 1;
            JL_ASSERT( u64 == counter );
        }

        // Verify there are no more items in the list
        JL_ASSERT_STATUS( JlGetObjectListNextItem( subListObject, &object, &subEnumerator ), JL_STATUS_END_OF_DATA );

    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &subListObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}